

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::UpdateBinder::BindExpression
          (BindResult *__return_storage_ptr__,UpdateBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  type expr;
  allocator local_59;
  BinderException local_58;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  if ((expr->super_BaseExpression).expression_class == WINDOW) {
    ::std::__cxx11::string::string
              ((string *)&local_48,"window functions are not allowed in UPDATE",&local_59);
    BinderException::Unsupported(&local_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
    ::std::runtime_error::~runtime_error((runtime_error *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ExpressionBinder::BindExpression
              (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult UpdateBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::WINDOW:
		return BindResult(BinderException::Unsupported(expr, "window functions are not allowed in UPDATE"));
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}